

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServer::cmServer(cmServer *this,cmConnection *conn,bool supportExperimental)

{
  cmServerProtocol *protocol;
  
  cmServerBase::cmServerBase(&this->super_cmServerBase,conn);
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmServer_006052d0;
  (this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->SupportExperimental = supportExperimental;
  this->Protocol = (cmServerProtocol *)0x0;
  (this->SupportedProtocols).
  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SupportedProtocols).
  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SupportedProtocols).
  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  protocol = (cmServerProtocol *)operator_new(0xe0);
  (protocol->m_CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
  super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.super__Head_base<0UL,_cmake_*,_false>
  ._M_head_impl = (cmake *)0x0;
  protocol->m_Server = (cmServer *)0x0;
  protocol->_vptr_cmServerProtocol = (_func_int **)&PTR__cmServerProtocol1_00605690;
  *(undefined4 *)&protocol[1]._vptr_cmServerProtocol = 0;
  *(undefined1 *)((long)&protocol[1]._vptr_cmServerProtocol + 4) = 0;
  protocol[1].m_CMakeInstance._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
  super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.super__Head_base<0UL,_cmake_*,_false>
  ._M_head_impl = (cmake *)(protocol + 2);
  protocol[1].m_Server = (cmServer *)0x0;
  *(undefined1 *)&protocol[2]._vptr_cmServerProtocol = 0;
  protocol[2].m_Server = (cmServer *)&protocol[3].m_CMakeInstance;
  protocol[3]._vptr_cmServerProtocol = (_func_int **)0x0;
  *(undefined1 *)
   &protocol[3].m_CMakeInstance._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
    super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
    super__Head_base<0UL,_cmake_*,_false>._M_head_impl = 0;
  protocol[4]._vptr_cmServerProtocol = (_func_int **)&protocol[4].m_Server;
  protocol[4].m_CMakeInstance._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
  super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.super__Head_base<0UL,_cmake_*,_false>
  ._M_head_impl = (cmake *)0x0;
  *(undefined1 *)&protocol[4].m_Server = 0;
  protocol[5].m_CMakeInstance._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
  super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.super__Head_base<0UL,_cmake_*,_false>
  ._M_head_impl = (cmake *)(protocol + 6);
  protocol[5].m_Server = (cmServer *)0x0;
  *(undefined1 *)&protocol[6]._vptr_cmServerProtocol = 0;
  protocol[6].m_Server = (cmServer *)&protocol[7].m_CMakeInstance;
  protocol[7]._vptr_cmServerProtocol = (_func_int **)0x0;
  *(undefined1 *)
   &protocol[7].m_CMakeInstance._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
    super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
    super__Head_base<0UL,_cmake_*,_false>._M_head_impl = 0;
  protocol[8]._vptr_cmServerProtocol = (_func_int **)&protocol[8].m_Server;
  protocol[8].m_CMakeInstance._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
  super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.super__Head_base<0UL,_cmake_*,_false>
  ._M_head_impl = (cmake *)0x0;
  *(undefined1 *)&protocol[8].m_Server = 0;
  RegisterProtocol(this,protocol);
  return;
}

Assistant:

cmServer::cmServer(cmConnection* conn, bool supportExperimental)
  : cmServerBase(conn)
  , SupportExperimental(supportExperimental)
{
  // Register supported protocols:
  this->RegisterProtocol(new cmServerProtocol1);
}